

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  Tables *pTVar1;
  bool bVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  MutexLockMaybe lock;
  MutexLockMaybe local_38;
  key_type local_30;
  
  local_38.mu_ = this->mutex_;
  if (local_38.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_38.mu_);
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    local_30.first = extendee;
    local_30.second = number;
    cVar3 = std::
            _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::find(&(pTVar1->extensions_)._M_t,&local_30);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(pTVar1->extensions_)._M_t._M_impl.super__Rb_tree_header) {
      p_Var4 = (_Base_ptr)0x0;
    }
    else {
      p_Var4 = cVar3._M_node[1]._M_left;
    }
    if (p_Var4 == (_Base_ptr)0x0) {
      if (this->underlay_ != (DescriptorPool *)0x0) {
        p_Var4 = (_Base_ptr)FindExtensionByNumber(this->underlay_,extendee,number);
        if (p_Var4 != (_Base_ptr)0x0) goto LAB_001cc9b6;
      }
      bVar2 = TryFindExtensionInFallbackDatabase(this,extendee,number);
      if (bVar2) {
        pTVar1 = (this->tables_).ptr_;
        if (pTVar1 == (Tables *)0x0) goto LAB_001cc9cd;
        local_30.first = extendee;
        local_30.second = number;
        cVar3 = std::
                _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::find(&(pTVar1->extensions_)._M_t,&local_30);
        if ((_Rb_tree_header *)cVar3._M_node ==
            &(pTVar1->extensions_)._M_t._M_impl.super__Rb_tree_header) {
          p_Var4 = (_Base_ptr)0x0;
        }
        else {
          p_Var4 = cVar3._M_node[1]._M_left;
        }
        if (p_Var4 != (_Base_ptr)0x0) goto LAB_001cc9b6;
      }
      p_Var4 = (_Base_ptr)0x0;
    }
LAB_001cc9b6:
    internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
    return (FieldDescriptor *)p_Var4;
  }
LAB_001cc9cd:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1e2,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  MutexLockMaybe lock(mutex_);
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != NULL) {
    return result;
  }
  if (underlay_ != NULL) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != NULL) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != NULL) {
      return result;
    }
  }
  return NULL;
}